

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yprp_type(lys_ypr_ctx_conflict *pctx,lysp_type *type)

{
  char *text;
  ulong local_58;
  ulong local_48;
  ulong local_38;
  int8_t local_21;
  ulong uStack_20;
  int8_t flag;
  uint64_t u;
  lysp_type *type_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  local_21 = '\0';
  if ((pctx != (lys_ypr_ctx_conflict *)0x0) && (type != (lysp_type *)0x0)) {
    u = (uint64_t)type;
    type_local = (lysp_type *)pctx;
    ypr_open(pctx,"type","name",type->name,'\0');
    *(short *)&type_local->range = *(short *)&type_local->range + 1;
    yprp_extension_instances
              ((lys_ypr_ctx_conflict *)type_local,LY_STMT_TYPE,'\0',
               *(lysp_ext_instance **)(u + 0x48),&local_21);
    if (((*(long *)(u + 8) != 0) ||
        (((*(long *)(u + 0x10) != 0 || (*(long *)(u + 0x18) != 0)) || (*(long *)(u + 0x28) != 0))))
       || (*(long *)(u + 0x20) != 0)) {
      ypr_close_parent((lys_ypr_ctx_conflict *)type_local,&local_21);
    }
    yprp_restr((lys_ypr_ctx_conflict *)type_local,*(lysp_restr **)(u + 8),LY_STMT_RANGE,"value",
               &local_21);
    yprp_restr((lys_ypr_ctx_conflict *)type_local,*(lysp_restr **)(u + 0x10),LY_STMT_LENGTH,"value",
               &local_21);
    uStack_20 = 0;
    while( true ) {
      if (*(long *)(u + 0x18) == 0) {
        local_38 = 0;
      }
      else {
        local_38 = *(ulong *)(*(long *)(u + 0x18) + -8);
      }
      if (local_38 <= uStack_20) break;
      yprp_restr((lys_ypr_ctx_conflict *)type_local,
                 (lysp_restr *)(*(long *)(u + 0x18) + uStack_20 * 0x40),LY_STMT_PATTERN,"value",
                 &local_21);
      uStack_20 = uStack_20 + 1;
    }
    yprp_enum((lys_ypr_ctx_conflict *)type_local,*(lysp_type_enum **)(u + 0x28),LY_TYPE_BITS,
              &local_21);
    yprp_enum((lys_ypr_ctx_conflict *)type_local,*(lysp_type_enum **)(u + 0x20),LY_TYPE_ENUM,
              &local_21);
    if (*(long *)(u + 0x30) != 0) {
      ypr_close_parent((lys_ypr_ctx_conflict *)type_local,&local_21);
      ypr_substmt((lys_ypr_ctx_conflict *)type_local,LY_STMT_PATH,'\0',
                  *(char **)(*(long *)(u + 0x30) + 0x28),*(void **)(u + 0x48));
    }
    if ((*(ushort *)(u + 0x62) & 0x200) != 0) {
      ypr_close_parent((lys_ypr_ctx_conflict *)type_local,&local_21);
      text = "false";
      if (*(char *)(u + 0x61) != '\0') {
        text = "true";
      }
      ypr_substmt((lys_ypr_ctx_conflict *)type_local,LY_STMT_REQUIRE_INSTANCE,'\0',text,
                  *(void **)(u + 0x48));
    }
    if ((*(ushort *)(u + 0x62) & 8) != 0) {
      ypr_close_parent((lys_ypr_ctx_conflict *)type_local,&local_21);
      ypr_unsigned((lys_ypr_ctx_conflict *)type_local,LY_STMT_FRACTION_DIGITS,'\0',
                   *(void **)(u + 0x48),(ulong)*(byte *)(u + 0x60));
    }
    uStack_20 = 0;
    while( true ) {
      if (*(long *)(u + 0x38) == 0) {
        local_48 = 0;
      }
      else {
        local_48 = *(ulong *)(*(long *)(u + 0x38) + -8);
      }
      if (local_48 <= uStack_20) break;
      ypr_close_parent((lys_ypr_ctx_conflict *)type_local,&local_21);
      ypr_substmt((lys_ypr_ctx_conflict *)type_local,LY_STMT_BASE,(uint8_t)uStack_20,
                  *(char **)(*(long *)(u + 0x38) + uStack_20 * 8),*(void **)(u + 0x48));
      uStack_20 = uStack_20 + 1;
    }
    uStack_20 = 0;
    while( true ) {
      if (*(long *)(u + 0x40) == 0) {
        local_58 = 0;
      }
      else {
        local_58 = *(ulong *)(*(long *)(u + 0x40) + -8);
      }
      if (local_58 <= uStack_20) break;
      ypr_close_parent((lys_ypr_ctx_conflict *)type_local,&local_21);
      yprp_type((lys_ypr_ctx_conflict *)type_local,
                (lysp_type *)(*(long *)(u + 0x40) + uStack_20 * 0x68));
      uStack_20 = uStack_20 + 1;
    }
    *(short *)&type_local->range = *(short *)&type_local->range + -1;
    ypr_close((lys_ypr_ctx_conflict *)type_local,"type",local_21);
  }
  return;
}

Assistant:

static void
yprp_type(struct lys_ypr_ctx *pctx, const struct lysp_type *type)
{
    LY_ARRAY_COUNT_TYPE u;
    int8_t flag = 0;

    if (!pctx || !type) {
        return;
    }

    ypr_open(pctx, "type", "name", type->name, flag);
    LEVEL++;

    yprp_extension_instances(pctx, LY_STMT_TYPE, 0, type->exts, &flag);

    if (type->range || type->length || type->patterns || type->bits || type->enums) {
        ypr_close_parent(pctx, &flag);
    }
    yprp_restr(pctx, type->range, LY_STMT_RANGE, "value", &flag);
    yprp_restr(pctx, type->length, LY_STMT_LENGTH, "value", &flag);
    LY_ARRAY_FOR(type->patterns, u) {
        yprp_restr(pctx, &type->patterns[u], LY_STMT_PATTERN, "value", &flag);
    }
    yprp_enum(pctx, type->bits, LY_TYPE_BITS, &flag);
    yprp_enum(pctx, type->enums, LY_TYPE_ENUM, &flag);

    if (type->path) {
        ypr_close_parent(pctx, &flag);
        ypr_substmt(pctx, LY_STMT_PATH, 0, type->path->expr, type->exts);
    }
    if (type->flags & LYS_SET_REQINST) {
        ypr_close_parent(pctx, &flag);
        ypr_substmt(pctx, LY_STMT_REQUIRE_INSTANCE, 0, type->require_instance ? "true" : "false", type->exts);
    }
    if (type->flags & LYS_SET_FRDIGITS) {
        ypr_close_parent(pctx, &flag);
        ypr_unsigned(pctx, LY_STMT_FRACTION_DIGITS, 0, type->exts, type->fraction_digits);
    }
    LY_ARRAY_FOR(type->bases, u) {
        ypr_close_parent(pctx, &flag);
        ypr_substmt(pctx, LY_STMT_BASE, u, type->bases[u], type->exts);
    }
    LY_ARRAY_FOR(type->types, u) {
        ypr_close_parent(pctx, &flag);
        yprp_type(pctx, &type->types[u]);
    }

    LEVEL--;
    ypr_close(pctx, "type", flag);
}